

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_doing(Curl_easy *data,_Bool *dophase_done)

{
  CURLcode local_1c;
  CURLcode result;
  _Bool *dophase_done_local;
  Curl_easy *data_local;
  
  local_1c = pop3_multi_statemach(data,dophase_done);
  if ((local_1c == CURLE_OK) && ((*dophase_done & 1U) != 0)) {
    local_1c = pop3_dophase_done(data,false);
  }
  return local_1c;
}

Assistant:

static CURLcode pop3_doing(struct Curl_easy *data, bool *dophase_done)
{
  CURLcode result = pop3_multi_statemach(data, dophase_done);

  if(result)
    DEBUGF(infof(data, "DO phase failed"));
  else if(*dophase_done) {
    result = pop3_dophase_done(data, FALSE /* not connected */);

    DEBUGF(infof(data, "DO phase is complete"));
  }

  return result;
}